

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype QtPrivate::lastIndexOf
                    (QLatin1StringView haystack,qsizetype from,QLatin1StringView needle,
                    CaseSensitivity cs)

{
  byte bVar1;
  char32_t cVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  short sVar11;
  ushort uVar12;
  ushort uVar13;
  ulong uVar14;
  byte *pbVar15;
  long lVar16;
  QLatin1StringView rhs;
  QLatin1StringView lhs;
  
  pbVar15 = (byte *)needle.m_data;
  lVar6 = needle.m_size;
  pcVar8 = haystack.m_data;
  uVar14 = haystack.m_size;
  if (lVar6 == 1) {
    if (uVar14 != 0) {
      bVar1 = *pbVar15;
      uVar12 = (ushort)bVar1;
      if (from < 0) {
        lVar6 = uVar14 + from;
        if ((long)(uVar14 + from) < 0) {
          return -1;
        }
      }
      else {
        lVar6 = uVar14 - 1;
        if ((ulong)from <= uVar14) {
          lVar6 = from;
        }
      }
      if (cs == CaseSensitive) {
        if (-1 < lVar6) {
          do {
            if (pcVar8[lVar6] == bVar1) {
              return lVar6;
            }
            lVar16 = lVar6 + -1;
            lVar6 = lVar6 + -1;
          } while (pcVar8 <= pcVar8 + lVar16);
        }
      }
      else {
        sVar11 = (short)((uint)(int)(short)*(ushort *)
                                            (QUnicodeTables::uc_properties +
                                            (ulong)*(ushort *)
                                                    (QUnicodeTables::uc_property_trie +
                                                    (ulong)(((ushort)bVar1 & 0x1f) +
                                                           (uint)*(ushort *)
                                                                  (QUnicodeTables::uc_property_trie
                                                                  + (ulong)(bVar1 >> 5) * 2)) * 2) *
                                            0x14 + 0xe) >> 1);
        if ((*(ushort *)
              (QUnicodeTables::uc_properties +
              (ulong)*(ushort *)
                      (QUnicodeTables::uc_property_trie +
                      (ulong)(((ushort)bVar1 & 0x1f) +
                             (uint)*(ushort *)
                                    (QUnicodeTables::uc_property_trie + (ulong)(bVar1 >> 5) * 2)) *
                      2) * 0x14 + 0xe) & 1) == 0) {
          uVar12 = sVar11 + (ushort)bVar1;
        }
        else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar11 * 2) == 1) {
          uVar12 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar11 * 2 + 2);
        }
        if (-1 < lVar6) {
          do {
            bVar1 = pcVar8[lVar6];
            uVar13 = (ushort)bVar1;
            sVar11 = (short)((uint)(int)(short)*(ushort *)
                                                (QUnicodeTables::uc_properties +
                                                (ulong)*(ushort *)
                                                        (QUnicodeTables::uc_property_trie +
                                                        (ulong)((bVar1 & 0x1f) +
                                                               (uint)*(ushort *)
                                                                      (QUnicodeTables::
                                                                       uc_property_trie +
                                                                      (ulong)(bVar1 >> 5) * 2)) * 2)
                                                * 0x14 + 0xe) >> 1);
            if ((*(ushort *)
                  (QUnicodeTables::uc_properties +
                  (ulong)*(ushort *)
                          (QUnicodeTables::uc_property_trie +
                          (ulong)((bVar1 & 0x1f) +
                                 (uint)*(ushort *)
                                        (QUnicodeTables::uc_property_trie + (ulong)(bVar1 >> 5) * 2)
                                 ) * 2) * 0x14 + 0xe) & 1) == 0) {
              uVar13 = (ushort)bVar1 + sVar11;
            }
            else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar11 * 2) == 1) {
              uVar13 = *(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar11 * 2 + 2);
            }
            if (uVar13 == uVar12) {
              return lVar6;
            }
            lVar16 = lVar6 + -1;
            lVar6 = lVar6 + -1;
          } while (pcVar8 <= pcVar8 + lVar16);
        }
      }
    }
  }
  else {
    uVar7 = (from >> 0x3f & uVar14) + from;
    if (uVar7 == uVar14 && lVar6 == 0) {
      return uVar14;
    }
    uVar5 = uVar14 - lVar6;
    if (-1 < (long)uVar5 && uVar7 <= uVar14) {
      if ((long)uVar7 < (long)uVar5) {
        uVar5 = uVar7;
      }
      uVar14 = 0;
      if (lVar6 != 0) {
        uVar14 = lVar6 - 1;
      }
      if (cs == CaseSensitive) {
        if (lVar6 < 1) {
          lVar4 = 0;
          lVar16 = 0;
        }
        else {
          lVar16 = 0;
          lVar4 = 0;
          lVar9 = lVar6;
          do {
            lVar16 = (ulong)pbVar15[lVar9 - (ulong)(lVar6 != 0)] + lVar16 * 2;
            lVar4 = (ulong)(byte)pcVar8[lVar9 + (uVar5 - (lVar6 != 0))] + lVar4 * 2;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        if (-1 < (long)uVar7) {
          lVar4 = lVar4 - (ulong)(byte)pcVar8[uVar5];
          do {
            lVar4 = (ulong)(byte)pcVar8[uVar5] + lVar4;
            if ((lVar4 == lVar16) &&
               (rhs.m_data = pcVar8 + uVar5, rhs.m_size = lVar6,
               iVar3 = compareStrings(needle,rhs,CaseSensitive), iVar3 == 0)) {
              return uVar5;
            }
            if (uVar14 < 0x40) {
              lVar4 = lVar4 - ((ulong)(byte)pcVar8[uVar5 + lVar6 + -1] << ((byte)uVar14 & 0x3f));
            }
            lVar4 = lVar4 * 2;
            lVar9 = uVar5 - 1;
            uVar5 = uVar5 - 1;
          } while (pcVar8 <= pcVar8 + lVar9);
        }
      }
      else {
        pcVar10 = pcVar8;
        if (lVar6 < 1) {
          lVar4 = 0;
          lVar16 = 0;
        }
        else {
          lVar16 = 0;
          lVar4 = 0;
          lVar9 = lVar6;
          do {
            cVar2 = (anonymous_namespace)::foldCaseHelper<char_const*>
                              ((char *)(ulong)pbVar15[lVar9 - (ulong)(lVar6 != 0)],pcVar10);
            lVar16 = (ulong)(uint)cVar2 + lVar16 * 2;
            cVar2 = (anonymous_namespace)::foldCaseHelper<char_const*>
                              ((char *)(ulong)(byte)pcVar8[lVar9 + (uVar5 - (lVar6 != 0))],pcVar10);
            lVar4 = (ulong)(uint)cVar2 + lVar4 * 2;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        if (-1 < (long)uVar7) {
          cVar2 = (anonymous_namespace)::foldCaseHelper<char_const*>
                            ((char *)(ulong)(byte)pcVar8[uVar5],pcVar10);
          lVar4 = lVar4 - (ulong)(uint)cVar2;
          do {
            cVar2 = (anonymous_namespace)::foldCaseHelper<char_const*>
                              ((char *)(ulong)(byte)pcVar8[uVar5],pcVar10);
            lVar4 = (ulong)(uint)cVar2 + lVar4;
            if (lVar4 == lVar16) {
              pcVar10 = pcVar8 + uVar5;
              lhs.m_data = pcVar10;
              lhs.m_size = lVar6;
              iVar3 = compareStrings(lhs,needle,CaseInsensitive);
              if (iVar3 == 0) {
                return uVar5;
              }
            }
            if (uVar14 < 0x40) {
              cVar2 = (anonymous_namespace)::foldCaseHelper<char_const*>
                                ((char *)(ulong)(byte)pcVar8[uVar5 + lVar6 + -1],pcVar10);
              lVar4 = lVar4 - ((ulong)(uint)cVar2 << ((byte)uVar14 & 0x3f));
            }
            lVar4 = lVar4 * 2;
            lVar9 = uVar5 - 1;
            uVar5 = uVar5 - 1;
          } while (pcVar8 <= pcVar8 + lVar9);
        }
      }
    }
  }
  return -1;
}

Assistant:

qsizetype QtPrivate::lastIndexOf(QLatin1StringView haystack, qsizetype from, QLatin1StringView needle, Qt::CaseSensitivity cs) noexcept
{
    return qLastIndexOf(haystack, from, needle, cs);
}